

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentumJacobian
          (KinDynComputations *this,MatrixView<double> *centroidalMomentumJacobian)

{
  int iVar1;
  bool bVar2;
  index_type iVar3;
  long lVar4;
  MatrixView<double> *in_RSI;
  long in_RDI;
  Transform com_T_inertial;
  Transform com_T_base_in_inertial;
  Transform com_T_base_in_base;
  Rotation *A_R_B;
  Position *basePosition;
  Position com;
  bool ok;
  MatrixView<double> *in_stack_fffffffffffff698;
  Rotation *other;
  MatrixView<double> *in_stack_fffffffffffff6a0;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> *this_00;
  DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>_>
  *in_stack_fffffffffffff6a8;
  Transform *this_01;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *in_stack_fffffffffffff6b0;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *other_00;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff6b8;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *this_02;
  KinDynComputations *in_stack_fffffffffffff6c8;
  MatrixView<double> *in_stack_fffffffffffff6e8;
  MatrixView<double> *mat;
  bool local_881;
  MatrixView<double> *in_stack_fffffffffffff7d0;
  KinDynComputations *in_stack_fffffffffffff7d8;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  local_710 [88];
  undefined1 local_6b8 [96];
  Transform local_658 [176];
  MatrixView<double> local_5a8 [7];
  Position local_430 [24];
  Rotation local_418 [72];
  Transform local_3d0 [568];
  Position local_198 [24];
  Position local_180 [72];
  Rotation local_138 [24];
  Rotation local_120 [72];
  Transform local_d8 [96];
  undefined8 local_78;
  Position *local_70;
  bool local_19;
  bool local_1;
  
  iVar3 = MatrixView<double>::rows(in_RSI);
  local_881 = false;
  if (iVar3 == 6) {
    iVar3 = MatrixView<double>::cols(in_RSI);
    lVar4 = iDynTree::Model::getNrOfDOFs();
    local_881 = iVar3 == lVar4 + 6;
  }
  local_19 = local_881;
  if (local_881 == false) {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentumJacobian",
               "Wrong size in input centroidalMomentumJacobian");
    local_1 = false;
  }
  else {
    MatrixView<double>::MatrixView(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    bVar2 = getLinearAngularMomentumJacobian(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    if (bVar2) {
      getCenterOfMassPosition(in_stack_fffffffffffff6c8);
      iDynTree::FreeFloatingPos::worldBasePos();
      local_70 = (Position *)iDynTree::Transform::getPosition();
      iDynTree::FreeFloatingPos::worldBasePos();
      local_78 = iDynTree::Transform::getRotation();
      iVar1 = *(int *)(*(long *)(in_RDI + 8) + 4);
      if (iVar1 == 0) {
        other = (Rotation *)(local_6b8 + 0x18);
        iDynTree::Rotation::Identity();
        this_00 = (Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> *)
                  local_6b8;
        iDynTree::Position::operator-((Position *)this_00);
        this_01 = local_658;
        iDynTree::Transform::Transform(this_01,other,(Position *)this_00);
        other_00 = (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                    *)&stack0xfffffffffffff7d0;
        iDynTree::Transform::asAdjointTransformWrench();
        this_02 = local_710;
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)this_02);
        toEigen(in_stack_fffffffffffff6e8);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*(this_02,other_00);
        Eigen::
        DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_0>_>
        ::eval((DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>_>
                *)this_01);
        toEigen(in_stack_fffffffffffff6e8);
        Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>::operator=
                  (this_00,(DenseBase<Eigen::Matrix<double,_6,__1,_0,_6,__1>_> *)other);
        Eigen::Matrix<double,_6,_-1,_0,_6,_-1>::~Matrix((Matrix<double,_6,__1,_0,_6,__1> *)0x1cfebb)
        ;
      }
      else if (iVar1 == 1) {
        iDynTree::Rotation::Identity();
        iDynTree::Rotation::inverse();
        iDynTree::Position::operator-(local_198,local_70);
        iDynTree::Rotation::operator*(local_138,local_180);
        iDynTree::Transform::Transform(local_d8,local_120,(Position *)local_138);
        iDynTree::Transform::asAdjointTransformWrench();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffff6b8);
        toEigen(in_stack_fffffffffffff6e8);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
        Eigen::
        DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_0>_>
        ::eval(in_stack_fffffffffffff6a8);
        toEigen(in_stack_fffffffffffff6e8);
        Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>::operator=
                  ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> *)
                   in_stack_fffffffffffff6a0,
                   (DenseBase<Eigen::Matrix<double,_6,__1,_0,_6,__1>_> *)in_stack_fffffffffffff698);
        Eigen::Matrix<double,_6,_-1,_0,_6,_-1>::~Matrix((Matrix<double,_6,__1,_0,_6,__1> *)0x1cfc6d)
        ;
      }
      else {
        if (iVar1 != 2) {
          return false;
        }
        iDynTree::Rotation::Identity();
        iDynTree::Position::operator-(local_430,local_70);
        iDynTree::Transform::Transform(local_3d0,local_418,local_430);
        mat = local_5a8;
        iDynTree::Transform::asAdjointTransformWrench();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffff6b8);
        toEigen(mat);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
        Eigen::
        DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_0>_>
        ::eval(in_stack_fffffffffffff6a8);
        toEigen(mat);
        Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>::operator=
                  ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> *)
                   in_stack_fffffffffffff6a0,
                   (DenseBase<Eigen::Matrix<double,_6,__1,_0,_6,__1>_> *)in_stack_fffffffffffff698);
        Eigen::Matrix<double,_6,_-1,_0,_6,_-1>::~Matrix((Matrix<double,_6,__1,_0,_6,__1> *)0x1cfd99)
        ;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentumJacobian(MatrixView<double> centroidalMomentumJacobian)
{
    bool ok = (centroidalMomentumJacobian.rows() == 6)
        && (centroidalMomentumJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getCentroidalTotalMomentumJacobian",
                    "Wrong size in input centroidalMomentumJacobian");
        return false;
    }

    if (!getLinearAngularMomentumJacobian(centroidalMomentumJacobian))
    {
        return false;
    }

    // get CoM and base pose
    Position com = getCenterOfMassPosition();
    const Position& basePosition = pimpl->m_pos.worldBasePos().getPosition();
    const Rotation& A_R_B = pimpl->m_pos.worldBasePos().getRotation();

    switch (pimpl->m_frameVelRepr)
    {
    case BODY_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B). Here we want to
        // express the quantity in (G[B]).
        // J_G[B] = G[B]_X_B * J_B
        // where is G[B]_X_B is the adjoint wrench transformation

        Transform com_T_base_in_base(Rotation::Identity(), A_R_B.inverse() * (basePosition - com));

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_base.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case MIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B[A]). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_B[A] * J_B[A]
        // where is G[A]_X_B[A] is the adjoint wrench transformation

        Transform com_T_base_in_inertial(Rotation::Identity(), basePosition - com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case INERTIAL_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (A). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_A * J_A
        // where is G[A]_X_A is the adjoint wrench transformation
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);

        iDynTree::Transform com_T_inertial(Rotation::Identity(),  -com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    default:
        assert(false);
        return false;
    }

    return true;
}